

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffdkey(fitsfile *fptr,char *keyname,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  size_t sVar3;
  int keypos;
  char message [81];
  char cStack_119;
  char value [71];
  char valstring [71];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = ffgkey(fptr,keyname,valstring,comm,status);
  if (iVar2 < 1) {
    pFVar1 = fptr->Fptr;
    keypos = (int)((pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) / 0x50);
    ffdrec(fptr,keypos,status);
    iVar2 = *status;
    if (iVar2 < 1) {
      ffpmrk();
      ffc2s(valstring,value,status);
      if (*status != 0xcc) {
        do {
          sVar3 = strlen(value);
          do {
            if (((int)sVar3 == 0) || (value[(long)(int)sVar3 + -1] != '&')) goto LAB_00193bb2;
            message[0] = '\0';
            ffgcnt(fptr,value,message,status);
            sVar3 = 0;
          } while (message[0] == '\0' && value[0] == '\0');
          ffdrec(fptr,keypos,status);
        } while( true );
      }
      ffcmrk();
      *status = 0;
      iVar2 = 0;
    }
  }
  else {
    snprintf(message,0x51,"Could not find the %s keyword to delete (ffdkey)",keyname);
    ffpmsg(message);
LAB_00193bb2:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffdkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, comm, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                keyname);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, value, nextcomm, status);
        if (*value || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}